

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_utils.cpp
# Opt level: O0

string * str_utils::escape(string *str,char c)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char in_DL;
  ulong in_RSI;
  string *in_RDI;
  int i;
  string *escaped_str;
  allocator local_49;
  string local_48 [48];
  int local_18;
  undefined1 local_12;
  char local_11;
  ulong local_10;
  
  local_12 = 0;
  local_11 = in_DL;
  local_10 = in_RSI;
  std::__cxx11::string::string(in_RDI);
  for (local_18 = 0; iVar2 = local_18, iVar3 = std::__cxx11::string::size(), iVar2 < iVar3;
      local_18 = local_18 + 1) {
    pcVar4 = (char *)std::__cxx11::string::operator[](local_10);
    if (*pcVar4 == local_11) {
      std::__cxx11::string::operator+=(in_RDI,"\\");
    }
    pcVar4 = (char *)std::__cxx11::string::operator[](local_10);
    cVar1 = *pcVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,1,cVar1,&local_49);
    std::__cxx11::string::operator+=(in_RDI,local_48);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  return in_RDI;
}

Assistant:

std::string escape(const std::string& str, char c) {
    std::string escaped_str;
    for (int i = 0; i < int(str.size()); i++) {
        if (str[i] == c)
            escaped_str += "\\";
        escaped_str += std::string(1, str[i]);
    }
    return escaped_str;
}